

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  sqlite3 *db;
  u8 uVar1;
  Expr *pEVar2;
  int iVar3;
  uint uVar4;
  Select *pSVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  IdList_item *pIVar9;
  
  if (pList == (ExprList *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)pList->nExpr;
  }
  db = pParse->db;
  if (pExpr == (Expr *)0x0 || pColumns == (IdList *)0x0) goto LAB_0017b847;
  uVar1 = pExpr->op;
  if (uVar1 != 0x8a) {
    if (uVar1 == 0xb0) {
      uVar1 = pExpr->op2;
    }
    pSVar5 = (Select *)pExpr;
    if (uVar1 == 0xb1) {
LAB_0017b792:
      iVar3 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pList->nExpr;
    }
    else {
      iVar3 = 1;
      if (uVar1 == 0x8a) {
        pSVar5 = (pExpr->x).pSelect;
        goto LAB_0017b792;
      }
    }
    if (pColumns->nId != iVar3) {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values");
      goto LAB_0017b847;
    }
  }
  uVar4 = pColumns->nId;
  uVar6 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    pIVar9 = pColumns->a;
    lVar7 = 0;
    do {
      pEVar2 = sqlite3ExprForVectorField(pParse,pExpr,(int)lVar7,(int)uVar6);
      if (pEVar2 != (Expr *)0x0) {
        pList = sqlite3ExprListAppend(pParse,pList,pEVar2);
        if (pList != (ExprList *)0x0) {
          pList->a[(long)pList->nExpr + -1].zEName = pIVar9->zName;
          pIVar9->zName = (char *)0x0;
        }
      }
      lVar7 = lVar7 + 1;
      uVar4 = pColumns->nId;
      uVar6 = (ulong)(int)uVar4;
      pIVar9 = pIVar9 + 1;
    } while (lVar7 < (long)uVar6);
  }
  if (((db->mallocFailed == '\0') && (pExpr->op == 0x8a)) && (pList != (ExprList *)0x0)) {
    pEVar2 = pList->a[lVar8].pExpr;
    pEVar2->pRight = pExpr;
    pEVar2->iTable = uVar4;
    pExpr = (Expr *)0x0;
  }
LAB_0017b847:
  sqlite3ExprUnmapAndDelete(pParse,pExpr);
  sqlite3IdListDelete(db,pColumns);
  return pList;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT,
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i, pColumns->nId);
    assert( pSubExpr!=0 || db->mallocFailed );
    if( pSubExpr==0 ) continue;
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zEName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );

    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  sqlite3ExprUnmapAndDelete(pParse, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}